

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O3

bool __thiscall QWhatsThisPrivate::eventFilter(QWhatsThisPrivate *this,QObject *o,QEvent *e)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  QMouseEvent *me;
  long in_FS_OFFSET;
  double dVar7;
  undefined1 auVar8 [16];
  QPoint local_68;
  QPoint local_60;
  undefined1 *local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)(o + 8) + 0x30) & 1) == 0) goto switchD_003a148a_default;
  bVar2 = QWidget::testAttribute_helper((QWidget *)o,WA_CustomWhatsThis);
  switch(*(undefined2 *)(e + 8)) {
  case 2:
    if (bVar2 || *(int *)(e + 0x40) == 2) goto switchD_003a148a_default;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    auVar8 = QEventPoint::position();
    dVar7 = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._0_8_;
    bVar2 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_60.xp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar7);
    dVar7 = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._8_8_;
    bVar2 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_60.yp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar7);
    auVar8 = QEventPoint::globalPosition();
    dVar7 = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._0_8_;
    bVar2 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_68.xp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar7);
    dVar7 = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._8_8_;
    bVar2 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_68.yp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar7);
    QHelpEvent::QHelpEvent((QHelpEvent *)&local_58,WhatsThis,&local_60,&local_68);
    cVar3 = QCoreApplication::sendEvent(o,(QEvent *)&local_58);
    if ((cVar3 == '\0') || (uStack_50._4_1_ == '\0')) {
      this->leaveOnMouseRelease = true;
    }
    QHelpEvent::~QHelpEvent((QHelpEvent *)&local_58);
    break;
  case 3:
  case 4:
    goto switchD_003a148a_caseD_3;
  case 5:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    auVar8 = QEventPoint::position();
    dVar7 = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._0_8_;
    bVar1 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_60.xp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar7);
    dVar7 = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._8_8_;
    bVar1 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_60.yp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar7);
    auVar8 = QEventPoint::globalPosition();
    dVar7 = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._0_8_;
    bVar1 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_68.xp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar7);
    dVar7 = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar8._8_8_;
    bVar1 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    local_68.yp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar7);
    QHelpEvent::QHelpEvent((QHelpEvent *)&local_58,QueryWhatsThis,&local_60,&local_68);
    bVar4 = QCoreApplication::sendEvent(o,(QEvent *)&local_58);
    QCursor::QCursor((QCursor *)&local_60,bVar4 & uStack_50._4_1_ | ForbiddenCursor);
    QGuiApplication::changeOverrideCursor((QCursor *)&local_60);
    QCursor::~QCursor((QCursor *)&local_60);
    QHelpEvent::~QHelpEvent((QHelpEvent *)&local_58);
switchD_003a148a_caseD_3:
    if ((this->leaveOnMouseRelease == true) && (*(short *)(e + 8) == 3)) {
      QWhatsThis::leaveWhatsThisMode();
    }
    if (bVar2 || *(int *)(e + 0x40) == 2) {
switchD_003a148a_default:
      bVar2 = false;
      goto LAB_003a1815;
    }
    break;
  case 6:
    cVar3 = QKeyEvent::matches((StandardKey)e);
    if (cVar3 == '\0') {
      if ((bVar2) || (uVar6 = *(uint *)(e + 0x40), uVar6 == 0x1000055))
      goto switchD_003a148a_default;
      if (uVar6 == 0x1000039) {
        iVar5 = QKeyEvent::modifiers();
        if (iVar5 == 0x2000000) goto switchD_003a148a_default;
        uVar6 = *(uint *)(e + 0x40);
      }
      if ((uVar6 & 0xfffffffc) == 0x1000020) break;
    }
    QWhatsThis::leaveWhatsThisMode();
    break;
  default:
    goto switchD_003a148a_default;
  }
  bVar2 = true;
LAB_003a1815:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QWhatsThisPrivate::eventFilter(QObject *o, QEvent *e)
{
    if (!o->isWidgetType())
        return false;
    QWidget * w = static_cast<QWidget *>(o);
    bool customWhatsThis = w->testAttribute(Qt::WA_CustomWhatsThis);
    switch (e->type()) {
    case QEvent::MouseButtonPress:
    {
        QMouseEvent *me = static_cast<QMouseEvent*>(e);
        if (me->button() == Qt::RightButton || customWhatsThis)
            return false;
        QHelpEvent e(QEvent::WhatsThis, me->position().toPoint(), me->globalPosition().toPoint());
        if (!QCoreApplication::sendEvent(w, &e) || !e.isAccepted())
            leaveOnMouseRelease = true;

    } break;

    case QEvent::MouseMove:
    {
        QMouseEvent *me = static_cast<QMouseEvent*>(e);
        QHelpEvent e(QEvent::QueryWhatsThis, me->position().toPoint(), me->globalPosition().toPoint());
        const bool sentEvent = QCoreApplication::sendEvent(w, &e);
#ifdef QT_NO_CURSOR
        Q_UNUSED(sentEvent);
#else
        QGuiApplication::changeOverrideCursor((!sentEvent || !e.isAccepted())?
                                              Qt::ForbiddenCursor:Qt::WhatsThisCursor);
#endif
        Q_FALLTHROUGH();
    }
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
        if (leaveOnMouseRelease && e->type() == QEvent::MouseButtonRelease)
            QWhatsThis::leaveWhatsThisMode();
        if (static_cast<QMouseEvent*>(e)->button() == Qt::RightButton || customWhatsThis)
            return false; // ignore RMB release
        break;
    case QEvent::KeyPress:
    {
        QKeyEvent *kev = static_cast<QKeyEvent *>(e);
#if QT_CONFIG(shortcut)
        if (kev->matches(QKeySequence::Cancel)) {
            QWhatsThis::leaveWhatsThisMode();
            return true;
        } else
#endif
          if (customWhatsThis) {
            return false;
        } else if (kev->key() == Qt::Key_Menu ||
                    (kev->key() == Qt::Key_F10 &&
                      kev->modifiers() == Qt::ShiftModifier)) {
            // we don't react to these keys, they are used for context menus
            return false;
        } else if (kev->key() != Qt::Key_Shift && kev->key() != Qt::Key_Alt // not a modifier key
                   && kev->key() != Qt::Key_Control && kev->key() != Qt::Key_Meta) {
            QWhatsThis::leaveWhatsThisMode();
        }
    } break;
    default:
        return false;
    }
    return true;
}